

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int convert_fast_array_to_array(JSContext *ctx,JSObject *p)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  JSRefCountHeader *pJVar6;
  int iVar7;
  int iVar8;
  JSProperty *pJVar9;
  uint uVar10;
  JSString *pJVar11;
  
  iVar7 = js_shape_prepare_update(ctx,p,(JSShapeProperty **)0x0);
  iVar8 = -1;
  if (iVar7 == 0) {
    uVar2 = (p->u).array.count;
    uVar10 = p->shape->prop_count + uVar2;
    if (((uint)p->shape->prop_size < uVar10) &&
       (iVar8 = resize_properties(ctx,&p->shape,p,uVar10), iVar8 != 0)) {
      return -1;
    }
    pJVar11 = (p->u).regexp.bytecode;
    for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
      pJVar9 = add_property(ctx,p,uVar10 | 0x80000000,7);
      pJVar6 = &pJVar11->header;
      uVar3 = *(undefined4 *)&pJVar11->field_0x4;
      uVar4 = *(undefined4 *)&pJVar11->field_0x8;
      uVar5 = pJVar11->hash_next;
      pJVar11 = pJVar11 + 1;
      *(int *)&pJVar9->u = pJVar6->ref_count;
      *(undefined4 *)((long)&pJVar9->u + 4) = uVar3;
      *(undefined4 *)((long)&pJVar9->u + 8) = uVar4;
      *(uint32_t *)((long)&pJVar9->u + 0xc) = uVar5;
    }
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,(p->u).func.var_refs);
    (p->u).array.count = 0;
    (p->u).func.var_refs = (JSVarRef **)0x0;
    *(undefined4 *)&p->u = 0;
    puVar1 = &(p->field_0).header.dummy1;
    *puVar1 = *puVar1 & 0xf7;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int convert_fast_array_to_array(JSContext *ctx,
                                                             JSObject *p)
{
    JSProperty *pr;
    JSShape *sh;
    JSValue *tab;
    uint32_t i, len, new_count;

    if (js_shape_prepare_update(ctx, p, NULL))
        return -1;
    len = p->u.array.count;
    /* resize the properties once to simplify the error handling */
    sh = p->shape;
    new_count = sh->prop_count + len;
    if (new_count > sh->prop_size) {
        if (resize_properties(ctx, &p->shape, p, new_count))
            return -1;
    }

    tab = p->u.array.u.values;
    for(i = 0; i < len; i++) {
        /* add_property cannot fail here but
           __JS_AtomFromUInt32(i) fails for i > INT32_MAX */
        pr = add_property(ctx, p, __JS_AtomFromUInt32(i), JS_PROP_C_W_E);
        pr->u.value = *tab++;
    }
    js_free(ctx, p->u.array.u.values);
    p->u.array.count = 0;
    p->u.array.u.values = NULL; /* fail safe */
    p->u.array.u1.size = 0;
    p->fast_array = 0;
    return 0;
}